

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRBMemoryAllocator.cpp
# Opt level: O2

void __thiscall Diligent::SRBMemoryAllocator::~SRBMemoryAllocator(SRBMemoryAllocator *this)

{
  Uint32 UVar1;
  Uint32 UVar2;
  long lVar3;
  
  if (this->m_DataAllocators != (FixedBlockMemoryAllocator *)0x0) {
    UVar1 = this->m_ResourceCacheDataAllocatorCount;
    UVar2 = this->m_ShaderVariableDataAllocatorCount;
    for (lVar3 = 0; (ulong)(UVar1 + UVar2) * 0x130 - lVar3 != 0; lVar3 = lVar3 + 0x130) {
      FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator
                ((FixedBlockMemoryAllocator *)
                 ((long)&(this->m_DataAllocators->super_IMemoryAllocator)._vptr_IMemoryAllocator +
                 lVar3));
    }
    (*this->m_RawMemAllocator->_vptr_IMemoryAllocator[1])
              (this->m_RawMemAllocator,this->m_DataAllocators);
  }
  return;
}

Assistant:

SRBMemoryAllocator::~SRBMemoryAllocator()
{
    if (m_DataAllocators != nullptr)
    {
        auto TotalAllocatorCount = m_ShaderVariableDataAllocatorCount + m_ResourceCacheDataAllocatorCount;
        for (Uint32 s = 0; s < TotalAllocatorCount; ++s)
        {
            m_DataAllocators[s].~FixedBlockMemoryAllocator();
        }
        m_RawMemAllocator.Free(m_DataAllocators);
    }
}